

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitTest.hpp
# Opt level: O0

void Qentem::Test::TestStringToNumber1(QTest *test)

{
  SizeT64 SVar1;
  bool bVar2;
  uint local_5c [5];
  double local_48;
  double local_40;
  double local_38;
  uint local_2c;
  char *local_28;
  char *str;
  double d_number;
  SizeT64 number;
  QTest *test_local;
  
  d_number = 0.0;
  str = (char *)0x0;
  local_28 = "";
  number = (SizeT64)test;
  bVar2 = StringToNumber<unsigned_long_long>(test,(unsigned_long_long *)&d_number,"");
  QTest::IsFalse(test,bVar2,0x9a);
  SVar1 = number;
  local_28 = "0";
  bVar2 = StringToNumber<unsigned_long_long>((QTest *)number,(unsigned_long_long *)&d_number,"0");
  QTest::IsTrue((QTest *)SVar1,bVar2,0x9d);
  local_2c = 0;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,&local_2c,0x9e);
  SVar1 = number;
  local_28 = "0.0";
  bVar2 = StringToNumber<double>((QTest *)number,(double *)&str,"0.0");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xa1);
  local_38 = 0.0;
  QTest::IsEqual<double,double>((QTest *)number,(double *)&str,&local_38,0xa2);
  SVar1 = number;
  local_28 = "-0";
  bVar2 = StringToNumber<double>((QTest *)number,(double *)&str,"-0");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xa5);
  local_40 = -0.0;
  QTest::IsEqual<double,double>((QTest *)number,(double *)&str,&local_40,0xa6);
  SVar1 = number;
  local_28 = "-0.0";
  bVar2 = StringToNumber<double>((QTest *)number,(double *)&str,"-0.0");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xa9);
  local_48 = -0.0;
  QTest::IsEqual<double,double>((QTest *)number,(double *)&str,&local_48,0xaa);
  SVar1 = number;
  local_28 = "1";
  bVar2 = StringToNumber<unsigned_long_long>((QTest *)number,(unsigned_long_long *)&d_number,"1");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xad);
  local_5c[4] = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,local_5c + 4,0xae);
  SVar1 = number;
  local_28 = "1000000";
  bVar2 = StringToNumber<unsigned_long_long>
                    ((QTest *)number,(unsigned_long_long *)&d_number,"1000000");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xb1);
  local_5c[3] = 1000000;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,local_5c + 3,0xb2);
  SVar1 = number;
  local_28 = "1010101";
  bVar2 = StringToNumber<unsigned_long_long>
                    ((QTest *)number,(unsigned_long_long *)&d_number,"1010101");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xb5);
  local_5c[2] = 0xf69b5;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,local_5c + 2,0xb6);
  SVar1 = number;
  local_28 = "9999999";
  bVar2 = StringToNumber<unsigned_long_long>
                    ((QTest *)number,(unsigned_long_long *)&d_number,"9999999");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xb9);
  local_5c[1] = 9999999;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,local_5c + 1,0xba);
  SVar1 = number;
  local_28 = "123456789";
  bVar2 = StringToNumber<unsigned_long_long>
                    ((QTest *)number,(unsigned_long_long *)&d_number,"123456789");
  QTest::IsTrue((QTest *)SVar1,bVar2,0xbd);
  local_5c[0] = 0x75bcd15;
  QTest::IsEqual<unsigned_long_long,unsigned_int>
            ((QTest *)number,(unsigned_long_long *)&d_number,local_5c,0xbe);
  return;
}

Assistant:

static void TestStringToNumber1(QTest &test) {
    SizeT64     number   = 0;
    double      d_number = 0;
    const char *str;

    str = "";
    test.IsFalse(StringToNumber(test, number, str), __LINE__);

    str = "0";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 0U, __LINE__);

    str = "0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, 0.0, __LINE__);

    str = "-0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "-0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "1";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1U, __LINE__);

    str = "1000000";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1000000U, __LINE__);

    str = "1010101";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1010101U, __LINE__);

    str = "9999999";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 9999999U, __LINE__);

    str = "123456789";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 123456789U, __LINE__);
}